

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTportWeight.c
# Opt level: O1

sbfMwThread sbfTport_nextThread(sbfTport tport)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  sbfMwThread psVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  sbfMwThread psVar8;
  
  pthread_mutex_lock((pthread_mutex_t *)&tport->mWeightsLock);
  iVar2 = sbfMw_getNumThreads(tport->mMw);
  if (iVar2 == 0) {
    psVar8 = (sbfMwThread)0x0;
  }
  else {
    uVar6 = 0xffffffff;
    uVar7 = 0;
    psVar8 = (sbfMwThread)0x0;
    do {
      psVar4 = (sbfMwThread)sbfMw_getThread(tport->mMw,uVar7 & 0xffffffff);
      uVar1 = tport->mThreads;
      uVar5 = sbfMw_getThreadMask(psVar4);
      if (((uVar5 & ~uVar1) == 0) && (tport->mWeights[uVar7] < uVar6)) {
        psVar8 = psVar4;
        uVar6 = tport->mWeights[uVar7];
      }
      uVar7 = uVar7 + 1;
      uVar3 = sbfMw_getNumThreads(tport->mMw);
    } while (uVar7 < uVar3);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&tport->mWeightsLock);
  return psVar8;
}

Assistant:

sbfMwThread
sbfTport_nextThread (sbfTport tport)
{
    sbfMwThread thread;
    sbfMwThread found;
    u_int       weight;
    u_int       i;

    sbfMutex_lock (&tport->mWeightsLock);

    found = NULL;
    weight = UINT_MAX;

    for (i = 0; i < sbfMw_getNumThreads (tport->mMw); i++)
    {
        thread = sbfMw_getThread (tport->mMw, i);
        if (~tport->mThreads & sbfMw_getThreadMask (thread))
            continue;

        if (tport->mWeights[i] < weight)
        {
            found = thread;
            weight = tport->mWeights[i];
        }
    }

    sbfMutex_unlock (&tport->mWeightsLock);
    return found;
}